

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PtexReader.cpp
# Opt level: O2

void __thiscall
Ptex::v2_2::PtexReader::TiledFaceBase::getPixel(TiledFaceBase *this,int ui,int vi,void *result)

{
  int iVar1;
  undefined4 extraout_var;
  int iVar2;
  int iVar3;
  PtexPtr<Ptex::v2_2::PtexFaceData> tile;
  PtexPtr<Ptex::v2_2::PtexFaceData> local_38;
  
  iVar2 = ui >> ((this->_tileres).ulog2 & 0x1fU);
  iVar3 = vi >> ((this->_tileres).vlog2 & 0x1fU);
  iVar1 = (*(this->super_FaceData).super_PtexFaceData._vptr_PtexFaceData[9])
                    (this,(ulong)(uint)(this->_ntilesu * iVar3 + iVar2));
  local_38._ptr = (PtexFaceData *)CONCAT44(extraout_var,iVar1);
  (*(local_38._ptr)->_vptr_PtexFaceData[5])
            (local_38._ptr,(ulong)(uint)(ui - (iVar2 << ((this->_tileres).ulog2 & 0x1fU))),
             (ulong)(uint)(vi - (iVar3 << ((this->_tileres).vlog2 & 0x1fU))),result);
  PtexPtr<Ptex::v2_2::PtexFaceData>::~PtexPtr(&local_38);
  return;
}

Assistant:

void PtexReader::TiledFaceBase::getPixel(int ui, int vi, void* result)
{
    int tileu = ui >> _tileres.ulog2;
    int tilev = vi >> _tileres.vlog2;
    PtexPtr<PtexFaceData> tile ( getTile(tilev * _ntilesu + tileu) );
    tile->getPixel(ui - (tileu<<_tileres.ulog2),
                   vi - (tilev<<_tileres.vlog2), result);
}